

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * __thiscall
polyscope::prettyPrintCount_abi_cxx11_(string *__return_storage_ptr__,polyscope *this,size_t count)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_00 [56];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  double local_128;
  string local_120;
  string postfix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postFixes;
  char buf [50];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  undefined1 extraout_var [56];
  undefined1 auVar6 [64];
  
  if (this != (polyscope *)0x0) {
    auVar5._0_8_ = std::log10<unsigned_long>((unsigned_long)this);
    auVar5._8_56_ = extraout_var;
    auVar1 = vroundsd_avx(auVar5._0_16_,auVar5._0_16_,9);
    iVar3 = (int)(auVar1._0_8_ + 1.0);
    if (4 < iVar3) {
      std::__cxx11::string::string((string *)buf,"",(allocator *)&postfix);
      std::__cxx11::string::string((string *)(buf + 0x20),"K",(allocator *)&local_120);
      std::__cxx11::string::string(local_88,"M",&local_129);
      std::__cxx11::string::string(local_68,"B",&local_12a);
      std::__cxx11::string::string(local_48,"T",&local_12b);
      __l._M_len = 5;
      __l._M_array = (iterator)buf;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&postFixes,__l,&local_12c);
      lVar4 = 0x80;
      do {
        std::__cxx11::string::~string((string *)(buf + lVar4));
        auVar6._8_56_ = extraout_var_00;
        auVar6._0_8_ = extraout_XMM1_Qa;
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      auVar1 = vcvtusi2sd_avx512f(auVar6._0_16_,this);
      uVar2 = 0;
      local_128 = auVar1._0_8_;
      for (lVar4 = 0; 3 < iVar3 + (int)lVar4; lVar4 = lVar4 + -3) {
        uVar2 = uVar2 + 1;
        local_128 = local_128 / 1000.0;
      }
      postfix._M_dataplus._M_p = (pointer)&postfix.field_2;
      postfix._M_string_length = 0;
      postfix.field_2._M_local_buf[0] = '\0';
      if (uVar2 < (ulong)((long)postFixes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)postFixes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        std::__cxx11::string::_M_assign((string *)&postfix);
      }
      else {
        std::__cxx11::to_string(&local_120,-lVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                       "*10^",&local_120);
        std::__cxx11::string::operator=((string *)&postfix,(string *)buf);
        std::__cxx11::string::~string((string *)buf);
        std::__cxx11::string::~string((string *)&local_120);
      }
      iVar3 = iVar3 + (int)lVar4;
      if (iVar3 == 2) {
        snprintf(buf,0x32,"%2.1f%s",local_128,postfix._M_dataplus._M_p);
        std::__cxx11::string::string((string *)__return_storage_ptr__,buf,(allocator *)&local_120);
      }
      else if (iVar3 == 1) {
        snprintf(buf,0x32,"%2.2f%s",local_128,postfix._M_dataplus._M_p);
        std::__cxx11::string::string((string *)__return_storage_ptr__,buf,(allocator *)&local_120);
      }
      else {
        snprintf(buf,0x32,"%2.0f%s",local_128,postfix._M_dataplus._M_p);
        std::__cxx11::string::string((string *)__return_storage_ptr__,buf,(allocator *)&local_120);
      }
      std::__cxx11::string::~string((string *)&postfix);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&postFixes);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::to_string(__return_storage_ptr__,(unsigned_long)this);
  return __return_storage_ptr__;
}

Assistant:

std::string prettyPrintCount(size_t count) {

  int nDigits = 1;
  if (count > 0) {
    nDigits = 1 + std::floor(std::log10(count));
  }

  // Print small values exactly
  if (nDigits <= 4) {
    return std::to_string(count);
  }

  std::vector<std::string> postFixes = {"", "K", "M", "B", "T"};
  size_t iPostfix = 0;
  size_t iPow = 0;
  double countD = count;

  while (nDigits > 3) {
    count /= 1000;
    countD /= 1000;
    iPostfix++;
    iPow += 3;
    nDigits -= 3;
  }

  // Get a postfix, either as a predefined character or scientific notation
  std::string postfix;
  if (iPostfix < postFixes.size()) {
    postfix = postFixes[iPostfix];
  } else {
    postfix = "*10^" + std::to_string(iPow);
  }

  // Build the actual string
  char buf[50];
  if (nDigits == 1) {
    snprintf(buf, 50, "%2.2f%s", countD, postfix.c_str());
    return std::string(buf);
  } else if (nDigits == 2) {
    snprintf(buf, 50, "%2.1f%s", countD, postfix.c_str());
    return std::string(buf);
  } else /*(nDigits == 3) */ {
    snprintf(buf, 50, "%2.0f%s", countD, postfix.c_str());
    return std::string(buf);
  }
}